

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O0

bool __thiscall ScapeGoatTree::insertElement(ScapeGoatTree *this,int value)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Node *this_00;
  Node *local_38;
  Node *w;
  int d;
  Node *u;
  int value_local;
  ScapeGoatTree *this_local;
  
  this_00 = (Node *)operator_new(0x20);
  Node::Node(this_00,value);
  iVar1 = addWithDepth(this,this_00);
  iVar2 = log32(this,this->q);
  if (iVar2 < iVar1) {
    local_38 = this_00->parent;
    while( true ) {
      iVar2 = size(this,local_38);
      iVar2 = iVar2 * 3;
      iVar3 = size(this,local_38->parent);
      if (iVar2 != iVar3 * 2 && SBORROW4(iVar2,iVar3 * 2) == iVar2 + iVar3 * -2 < 0) break;
      local_38 = local_38->parent;
    }
    rebuild(this,local_38->parent);
  }
  return -1 < iVar1;
}

Assistant:

bool ScapeGoatTree::insertElement(int value) {
    /* first do basic insertion keeping track of depth */
    auto *u = new Node(value);
    int d = addWithDepth(u);
    if (d > log32(q)) {
        /* depth exceeded, find scapegoat */
        Node *w = u->parent;
        while (3 * size(w) <= 2 * size(w->parent)) {
            w = w->parent;
        }
        rebuild(w->parent);
    }
    return d >= 0;
}